

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl.cpp
# Opt level: O0

int LiveGLSLRender(LiveGLSL *live_glsl)

{
  HGUI handle;
  PFNGLGETUNIFORMLOCATIONPROC p_Var1;
  PFNGLUNIFORM1FPROC p_Var2;
  PFNGLUNIFORM1IPROC p_Var3;
  PFNGLUNIFORM2FPROC p_Var4;
  PFNGLUNIFORM3FPROC p_Var5;
  FILE *__stream;
  bool bVar6;
  __type _Var7;
  int iVar8;
  GLuint GVar9;
  GLint GVar10;
  int y_00;
  vector<RenderPass,_std::allocator<RenderPass>_> *pvVar11;
  vector<Texture,_std::allocator<Texture>_> *this;
  ulong uVar12;
  reference pGVar13;
  GLchar *pGVar14;
  reference pRVar15;
  ulong uVar16;
  void *data;
  char *filename;
  undefined8 uVar17;
  double dVar18;
  GLfloat local_304;
  uint local_2b8;
  uint local_2b4;
  int res;
  uchar *pixels;
  uint32_t height_1;
  uint32_t width_1;
  RenderPass *render_pass_4;
  iterator __end3_3;
  iterator __begin3_3;
  vector<RenderPass,_std::allocator<RenderPass>_> *__range3_3;
  GLint position_attrib;
  RenderPass *render_pass_3;
  iterator __end4_3;
  iterator __begin4_3;
  vector<RenderPass,_std::allocator<RenderPass>_> *__range4_3;
  reference local_200;
  Texture *texture_1;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  vector<Texture,_std::allocator<Texture>_> *__range4_2;
  GLuint uniform_location_1;
  GUIComponent *gui_component_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *__range4_1;
  reference local_198;
  RenderPass *other;
  iterator __end5;
  iterator __begin5;
  vector<RenderPass,_std::allocator<RenderPass>_> *__range5;
  int texture_unit;
  uint32_t height;
  uint32_t width;
  RenderPass *render_pass_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<RenderPass,_std::allocator<RenderPass>_> *__range3_2;
  undefined1 local_12c [8];
  GUITexture guiTexture_1;
  Texture *texture;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<Texture,_std::allocator<Texture>_> *__range3_1;
  uint32_t local_f8;
  GUITexture guiTexture;
  RenderPass *render_pass_1;
  iterator __end2;
  iterator __begin2;
  vector<RenderPass,_std::allocator<RenderPass>_> *__range2;
  vector<GUITexture,_std::allocator<GUITexture>_> textures;
  GLuint uniform_location;
  RenderPass *render_pass;
  iterator __end4;
  iterator __begin4;
  vector<RenderPass,_std::allocator<RenderPass>_> *__range4;
  GUIComponent *gui_component;
  iterator __end3;
  iterator __begin3;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *__range3;
  double dStack_68;
  int mouse_left_state;
  double y;
  double x;
  string local_48;
  undefined4 local_24;
  double dStack_20;
  uint32_t frame_count;
  double previous_time;
  LiveGLSL *live_glsl_local;
  
  previous_time = (double)live_glsl;
  dStack_20 = glfwGetTime();
  local_24 = 0;
  do {
    iVar8 = glfwWindowShouldClose(*(GLFWwindow **)((long)previous_time + 0x30));
    dVar18 = previous_time;
    if (iVar8 != 0) {
      return 0;
    }
    std::__cxx11::string::string((string *)&local_48,(string *)((long)previous_time + 0x98));
    ReloadShaderIfChanged((LiveGLSL *)dVar18,&local_48,false);
    std::__cxx11::string::~string((string *)&local_48);
    glfwGetCursorPos(*(GLFWwindow **)((long)previous_time + 0x30),&y,&stack0xffffffffffffff98);
    y = (double)*(float *)((long)previous_time + 0xe8) * y;
    dStack_68 = (double)*(float *)((long)previous_time + 0xe8) * dStack_68;
    iVar8 = glfwGetMouseButton(*(GLFWwindow **)((long)previous_time + 0x30),0);
    dVar18 = previous_time;
    if ((*(byte *)((long)previous_time + 0xed) & 1) != 0) {
      __end3 = std::vector<GUIComponent,_std::allocator<GUIComponent>_>::begin
                         ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)previous_time);
      gui_component =
           (GUIComponent *)
           std::vector<GUIComponent,_std::allocator<GUIComponent>_>::end
                     ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)dVar18);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                                         *)&gui_component), bVar6) {
        pGVar13 = __gnu_cxx::
                  __normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                  ::operator*(&__end3);
        pGVar13->IsInUse = false;
        pvVar11 = (vector<RenderPass,_std::allocator<RenderPass>_> *)((long)previous_time + 0x18);
        __end4 = std::vector<RenderPass,_std::allocator<RenderPass>_>::begin(pvVar11);
        render_pass = (RenderPass *)
                      std::vector<RenderPass,_std::allocator<RenderPass>_>::end(pvVar11);
        while (bVar6 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                                           *)&render_pass), bVar6) {
          pRVar15 = __gnu_cxx::
                    __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                    ::operator*(&__end4);
          p_Var1 = glad_glGetUniformLocation;
          GVar9 = (pRVar15->Program).Handle;
          pGVar14 = (GLchar *)std::__cxx11::string::c_str();
          textures.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = (*p_Var1)(GVar9,pGVar14);
          pGVar13->IsInUse =
               (pGVar13->IsInUse & 1U) != 0 ||
               textures.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ != -1;
          __gnu_cxx::
          __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>::
          operator++(&__end4);
        }
        __gnu_cxx::
        __normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
        ::operator++(&__end3);
      }
    }
    std::vector<GUITexture,_std::allocator<GUITexture>_>::vector
              ((vector<GUITexture,_std::allocator<GUITexture>_> *)&__range2);
    pvVar11 = (vector<RenderPass,_std::allocator<RenderPass>_> *)((long)previous_time + 0x18);
    __end2 = std::vector<RenderPass,_std::allocator<RenderPass>_>::begin(pvVar11);
    render_pass_1 = (RenderPass *)std::vector<RenderPass,_std::allocator<RenderPass>_>::end(pvVar11)
    ;
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                                       *)&render_pass_1), dVar18 = previous_time, bVar6) {
      guiTexture._4_8_ =
           __gnu_cxx::
           __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>::
           operator*(&__end2);
      if (((reference)guiTexture._4_8_)->TextureId != 0) {
        local_f8 = ((reference)guiTexture._4_8_)->Width;
        guiTexture.Id = ((reference)guiTexture._4_8_)->Height;
        __range3_1._4_4_ = ((reference)guiTexture._4_8_)->TextureId;
        std::vector<GUITexture,_std::allocator<GUITexture>_>::push_back
                  ((vector<GUITexture,_std::allocator<GUITexture>_> *)&__range2,
                   (value_type *)((long)&__range3_1 + 4));
      }
      this = (vector<Texture,_std::allocator<Texture>_> *)(guiTexture._4_8_ + 0x10);
      __end3_1 = std::vector<Texture,_std::allocator<Texture>_>::begin(this);
      texture = (Texture *)std::vector<Texture,_std::allocator<Texture>_>::end(this);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>
                                 *)&texture), bVar6) {
        guiTexture_1._4_8_ =
             __gnu_cxx::
             __normal_iterator<const_Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>::
             operator*(&__end3_1);
        local_12c._4_4_ = ((reference)guiTexture_1._4_8_)->Width;
        guiTexture_1.Id = ((reference)guiTexture_1._4_8_)->Height;
        local_12c._0_4_ = ((reference)guiTexture_1._4_8_)->Id;
        std::vector<GUITexture,_std::allocator<GUITexture>_>::push_back
                  ((vector<GUITexture,_std::allocator<GUITexture>_> *)&__range2,
                   (value_type *)local_12c);
        __gnu_cxx::
        __normal_iterator<const_Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>::
        operator++(&__end3_1);
      }
      __gnu_cxx::
      __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>::
      operator++(&__end2);
    }
    handle = *(HGUI *)((long)previous_time + 0x90);
    std::vector<GUITexture,_std::allocator<GUITexture>_>::vector
              ((vector<GUITexture,_std::allocator<GUITexture>_> *)&__range3_2,
               (vector<GUITexture,_std::allocator<GUITexture>_> *)&__range2);
    GUINewFrame(handle,(vector<GUIComponent,_std::allocator<GUIComponent>_> *)dVar18,
                (vector<GUITexture,_std::allocator<GUITexture>_> *)&__range3_2);
    std::vector<GUITexture,_std::allocator<GUITexture>_>::~vector
              ((vector<GUITexture,_std::allocator<GUITexture>_> *)&__range3_2);
    if ((*(byte *)((long)previous_time + 0xed) & 1) == 0) {
      (*glad_glBindFramebuffer)(0x8d40,0);
      (*glad_glClear)(0x4000);
LAB_0012dd11:
      GUIRender(*(HGUI *)((long)previous_time + 0x90));
      glfwSwapBuffers(*(GLFWwindow **)((long)previous_time + 0x30));
      if ((*(byte *)((long)previous_time + 0xee) & 1) == 0) {
        glfwWaitEvents();
      }
      else {
        glfwPollEvents();
      }
      bVar6 = false;
    }
    else {
      pvVar11 = (vector<RenderPass,_std::allocator<RenderPass>_> *)((long)previous_time + 0x18);
      __end3_2 = std::vector<RenderPass,_std::allocator<RenderPass>_>::begin(pvVar11);
      render_pass_2 =
           (RenderPass *)std::vector<RenderPass,_std::allocator<RenderPass>_>::end(pvVar11);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                                 *)&render_pass_2), bVar6) {
        pRVar15 = __gnu_cxx::
                  __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                  ::operator*(&__end3_2);
        if ((pRVar15->IsMain & 1U) == 0) {
          local_2b4 = pRVar15->Width;
        }
        else {
          local_2b4 = *(uint *)((long)previous_time + 0xd8);
        }
        if ((pRVar15->IsMain & 1U) == 0) {
          local_2b8 = pRVar15->Height;
        }
        else {
          local_2b8 = *(uint *)((long)previous_time + 0xdc);
        }
        uVar16 = (ulong)((float)local_2b4 * *(float *)((long)previous_time + 0xe8));
        uVar12 = (ulong)((float)local_2b8 * *(float *)((long)previous_time + 0xe8));
        (*glad_glBindFramebuffer)(0x8d40,pRVar15->FBO);
        (*glad_glClear)(0x4000);
        if ((pRVar15->Program).Handle == 0) {
          __assert_fail("render_pass.Program.Handle != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/liveglsl.cpp"
                        ,0xfb,"int LiveGLSLRender(LiveGLSL *)");
        }
        (*glad_glUseProgram)((pRVar15->Program).Handle);
        (*glad_glBindBuffer)(0x8892,*(GLuint *)((long)previous_time + 0xe0));
        (*glad_glViewport)(0,0,(GLsizei)uVar16,(GLsizei)uVar12);
        p_Var4 = glad_glUniform2f;
        GVar10 = (*glad_glGetUniformLocation)((pRVar15->Program).Handle,"resolution");
        (*p_Var4)(GVar10,(float)(uVar16 & 0xffffffff),(float)(uVar12 & 0xffffffff));
        p_Var2 = glad_glUniform1f;
        GVar10 = (*glad_glGetUniformLocation)((pRVar15->Program).Handle,"time");
        dVar18 = glfwGetTime();
        (*p_Var2)(GVar10,(float)dVar18);
        p_Var2 = glad_glUniform1f;
        GVar10 = (*glad_glGetUniformLocation)((pRVar15->Program).Handle,"pixel_ratio");
        (*p_Var2)(GVar10,*(GLfloat *)((long)previous_time + 0xe8));
        p_Var5 = glad_glUniform3f;
        GVar10 = (*glad_glGetUniformLocation)((pRVar15->Program).Handle,"mouse");
        local_304 = 1.0;
        if (iVar8 != 1) {
          local_304 = 0.0;
        }
        (*p_Var5)(GVar10,(float)y,(float)dStack_68,local_304);
        __range5._4_4_ = 0;
        uVar16 = std::__cxx11::string::empty();
        if ((uVar16 & 1) == 0) {
          pvVar11 = (vector<RenderPass,_std::allocator<RenderPass>_> *)((long)previous_time + 0x18);
          __end5 = std::vector<RenderPass,_std::allocator<RenderPass>_>::begin(pvVar11);
          other = (RenderPass *)std::vector<RenderPass,_std::allocator<RenderPass>_>::end(pvVar11);
          while (bVar6 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                                             *)&other), bVar6) {
            local_198 = __gnu_cxx::
                        __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                        ::operator*(&__end5);
            _Var7 = std::operator==(&local_198->Output,&pRVar15->Input);
            if (_Var7) {
              (*glad_glActiveTexture)(__range5._4_4_ + 0x84c0);
              (*glad_glBindTexture)(0xde1,local_198->TextureId);
              p_Var3 = glad_glUniform1i;
              p_Var1 = glad_glGetUniformLocation;
              GVar9 = (pRVar15->Program).Handle;
              pGVar14 = (GLchar *)std::__cxx11::string::c_str();
              GVar10 = (*p_Var1)(GVar9,pGVar14);
              (*p_Var3)(GVar10,__range5._4_4_);
              p_Var4 = glad_glUniform2f;
              p_Var1 = glad_glGetUniformLocation;
              GVar9 = (pRVar15->Program).Handle;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__range4_1,&pRVar15->Input,"_resolution");
              pGVar14 = (GLchar *)std::__cxx11::string::c_str();
              GVar10 = (*p_Var1)(GVar9,pGVar14);
              (*p_Var4)(GVar10,(float)local_198->Width,(float)local_198->Height);
              std::__cxx11::string::~string((string *)&__range4_1);
              __range5._4_4_ = __range5._4_4_ + 1;
            }
            __gnu_cxx::
            __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>::
            operator++(&__end5);
          }
        }
        dVar18 = previous_time;
        __end4_1 = std::vector<GUIComponent,_std::allocator<GUIComponent>_>::begin
                             ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)previous_time);
        gui_component_1 =
             (GUIComponent *)
             std::vector<GUIComponent,_std::allocator<GUIComponent>_>::end
                       ((vector<GUIComponent,_std::allocator<GUIComponent>_> *)dVar18);
        while (bVar6 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                                   *)&gui_component_1), bVar6) {
          pGVar13 = __gnu_cxx::
                    __normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
                    ::operator*(&__end4_1);
          p_Var1 = glad_glGetUniformLocation;
          GVar9 = (pRVar15->Program).Handle;
          pGVar14 = (GLchar *)std::__cxx11::string::c_str();
          GVar10 = (*p_Var1)(GVar9,pGVar14);
          switch(pGVar13->UniformType) {
          case EGUIUniformTypeFloat:
            (*glad_glUniform1f)(GVar10,pGVar13->Data[0]);
            break;
          case EGUIUniformTypeVec2:
            (*glad_glUniform2f)(GVar10,pGVar13->Data[0],pGVar13->Data[1]);
            break;
          case EGUIUniformTypeVec3:
            (*glad_glUniform3f)(GVar10,pGVar13->Data[0],pGVar13->Data[1],pGVar13->Data[2]);
            break;
          case EGUIUniformTypeVec4:
            (*glad_glUniform4f)(GVar10,pGVar13->Data[0],pGVar13->Data[1],pGVar13->Data[2],
                                pGVar13->Data[3]);
          }
          __gnu_cxx::
          __normal_iterator<GUIComponent_*,_std::vector<GUIComponent,_std::allocator<GUIComponent>_>_>
          ::operator++(&__end4_1);
        }
        __end4_2 = std::vector<Texture,_std::allocator<Texture>_>::begin(&pRVar15->Textures);
        texture_1 = (Texture *)
                    std::vector<Texture,_std::allocator<Texture>_>::end(&pRVar15->Textures);
        while (bVar6 = __gnu_cxx::operator!=
                                 (&__end4_2,
                                  (__normal_iterator<const_Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>
                                   *)&texture_1), bVar6) {
          local_200 = __gnu_cxx::
                      __normal_iterator<const_Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>
                      ::operator*(&__end4_2);
          (*glad_glActiveTexture)(__range5._4_4_ + 0x84c0);
          (*glad_glBindTexture)(0xde1,local_200->Id);
          p_Var3 = glad_glUniform1i;
          p_Var1 = glad_glGetUniformLocation;
          GVar9 = (pRVar15->Program).Handle;
          pGVar14 = (GLchar *)std::__cxx11::string::c_str();
          GVar10 = (*p_Var1)(GVar9,pGVar14);
          (*p_Var3)(GVar10,__range5._4_4_);
          p_Var4 = glad_glUniform2f;
          p_Var1 = glad_glGetUniformLocation;
          GVar9 = (pRVar15->Program).Handle;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__range4_3,&local_200->Binding,"_resolution");
          pGVar14 = (GLchar *)std::__cxx11::string::c_str();
          GVar10 = (*p_Var1)(GVar9,pGVar14);
          (*p_Var4)(GVar10,(float)local_200->Width,(float)local_200->Height);
          std::__cxx11::string::~string((string *)&__range4_3);
          __range5._4_4_ = __range5._4_4_ + 1;
          __gnu_cxx::
          __normal_iterator<const_Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>::
          operator++(&__end4_2);
        }
        (*glad_glBindVertexArray)(*(GLuint *)((long)previous_time + 0xe4));
        pvVar11 = (vector<RenderPass,_std::allocator<RenderPass>_> *)((long)previous_time + 0x18);
        __end4_3 = std::vector<RenderPass,_std::allocator<RenderPass>_>::begin(pvVar11);
        render_pass_3 =
             (RenderPass *)std::vector<RenderPass,_std::allocator<RenderPass>_>::end(pvVar11);
        while (bVar6 = __gnu_cxx::operator!=
                                 (&__end4_3,
                                  (__normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                                   *)&render_pass_3), bVar6) {
          pRVar15 = __gnu_cxx::
                    __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                    ::operator*(&__end4_3);
          if ((pRVar15->IsMain & 1U) != 0) {
            GVar9 = (*glad_glGetAttribLocation)((pRVar15->Program).Handle,"position");
            (*glad_glVertexAttribPointer)(GVar9,2,0x1406,'\0',8,(void *)0x0);
            (*glad_glEnableVertexAttribArray)(GVar9);
          }
          __gnu_cxx::
          __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>::
          operator++(&__end4_3);
        }
        (*glad_glDrawArrays)(4,0,6);
        __gnu_cxx::
        __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>::
        operator++(&__end3_2);
      }
      *(undefined1 *)((long)previous_time + 0xee) = 0;
      pvVar11 = (vector<RenderPass,_std::allocator<RenderPass>_> *)((long)previous_time + 0x18);
      __end3_3 = std::vector<RenderPass,_std::allocator<RenderPass>_>::begin(pvVar11);
      render_pass_4 =
           (RenderPass *)std::vector<RenderPass,_std::allocator<RenderPass>_>::end(pvVar11);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end3_3,
                                (__normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                                 *)&render_pass_4), bVar6) {
        pRVar15 = __gnu_cxx::
                  __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                  ::operator*(&__end3_3);
        GVar10 = (*glad_glGetUniformLocation)((pRVar15->Program).Handle,"time");
        *(bool *)((long)previous_time + 0xee) =
             (*(byte *)((long)previous_time + 0xee) & 1) != 0 || GVar10 != -1;
        __gnu_cxx::
        __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>::
        operator++(&__end3_3);
      }
      uVar16 = std::__cxx11::string::empty();
      if ((uVar16 & 1) != 0) goto LAB_0012dd11;
      iVar8 = (int)(long)((float)*(int *)((long)previous_time + 0xd8) *
                         *(float *)((long)previous_time + 0xe8));
      y_00 = (int)(long)((float)*(int *)((long)previous_time + 0xdc) *
                        *(float *)((long)previous_time + 0xe8));
      data = operator_new__((ulong)(uint)(iVar8 * y_00 * 3));
      (*glad_glReadPixels)(0,0,iVar8,y_00,0x1907,0x1401,data);
      filename = (char *)std::__cxx11::string::c_str();
      iVar8 = stbi_write_png(filename,iVar8,y_00,3,data,iVar8 * 3);
      if (data != (void *)0x0) {
        operator_delete__(data);
      }
      __stream = _stderr;
      if (iVar8 == 0) {
        uVar17 = std::__cxx11::string::c_str();
        fprintf(__stream,"Failed to write image to file: %s\n",uVar17);
        live_glsl_local._4_4_ = 1;
        bVar6 = true;
      }
      else {
        live_glsl_local._4_4_ = 0;
        bVar6 = true;
      }
    }
    std::vector<GUITexture,_std::allocator<GUITexture>_>::~vector
              ((vector<GUITexture,_std::allocator<GUITexture>_> *)&__range2);
    if (bVar6) {
      return live_glsl_local._4_4_;
    }
  } while( true );
}

Assistant:

int LiveGLSLRender(LiveGLSL* live_glsl) {
    double previous_time = glfwGetTime();
    uint32_t frame_count = 0;

    while (!glfwWindowShouldClose(live_glsl->GLFWWindowHandle)) {
        ReloadShaderIfChanged(live_glsl, live_glsl->ShaderPath);

        double x, y;
        glfwGetCursorPos(live_glsl->GLFWWindowHandle, &x, &y);
        x *= live_glsl->PixelDensity;
        y *= live_glsl->PixelDensity;

        int mouse_left_state = glfwGetMouseButton(live_glsl->GLFWWindowHandle, GLFW_MOUSE_BUTTON_LEFT);

        if (live_glsl->ShaderCompiled) {
            for (GUIComponent& gui_component : live_glsl->GUIComponents) {
                gui_component.IsInUse = false;
                for (const auto& render_pass : live_glsl->RenderPasses) {
                    GLuint uniform_location = glGetUniformLocation(render_pass.Program.Handle, gui_component.UniformName.c_str());
                    gui_component.IsInUse |= uniform_location != -1;
                }
            }
        }

        std::vector<GUITexture> textures;
        for (const auto& render_pass : live_glsl->RenderPasses) {
            if (render_pass.TextureId) {
                GUITexture guiTexture;
                guiTexture.Width = render_pass.Width;
                guiTexture.Height = render_pass.Height;
                guiTexture.Id = render_pass.TextureId;
                textures.push_back(guiTexture);
            }
            for (const auto& texture : render_pass.Textures) {
                GUITexture guiTexture;
                guiTexture.Width = texture.Width;
                guiTexture.Height = texture.Height;
                guiTexture.Id = texture.Id;
                textures.push_back(guiTexture);
            }
        }

        GUINewFrame(live_glsl->GUI, live_glsl->GUIComponents, textures);

        if (live_glsl->ShaderCompiled) {
            for (const auto& render_pass : live_glsl->RenderPasses) {
                uint32_t width = render_pass.IsMain ? live_glsl->WindowWidth : render_pass.Width;
                uint32_t height = render_pass.IsMain ? live_glsl->WindowHeight : render_pass.Height;

                width *= live_glsl->PixelDensity;
                height *= live_glsl->PixelDensity;

                glBindFramebuffer(GL_FRAMEBUFFER, render_pass.FBO);
                glClear(GL_COLOR_BUFFER_BIT);

                assert(render_pass.Program.Handle != 0);
                glUseProgram(render_pass.Program.Handle);

                glBindBuffer(GL_ARRAY_BUFFER, live_glsl->VertexBufferId);
                glViewport(0, 0, width, height);

                glUniform2f(glGetUniformLocation(render_pass.Program.Handle, "resolution"), width, height);
                glUniform1f(glGetUniformLocation(render_pass.Program.Handle, "time"), glfwGetTime());
                glUniform1f(glGetUniformLocation(render_pass.Program.Handle, "pixel_ratio"), live_glsl->PixelDensity);
                // Mouse position, x relative to left, y relative to top
                glUniform3f(glGetUniformLocation(render_pass.Program.Handle, "mouse"), x, y, mouse_left_state == GLFW_PRESS ? 1.0f : 0.0f);

                int texture_unit = 0;

                if (!render_pass.Input.empty()) {
                    for (const auto& other : live_glsl->RenderPasses) {
                        if (other.Output == render_pass.Input) {
                            glActiveTexture(GL_TEXTURE0 + texture_unit);
                            glBindTexture(GL_TEXTURE_2D, other.TextureId);
                            glUniform1i(glGetUniformLocation(render_pass.Program.Handle, render_pass.Input.c_str()), texture_unit);
                            glUniform2f(glGetUniformLocation(render_pass.Program.Handle, (render_pass.Input + "_resolution").c_str()), other.Width, other.Height);
                            ++texture_unit;
                        }
                    }
                }

                for (const GUIComponent& gui_component : live_glsl->GUIComponents) {
                    GLuint uniform_location = glGetUniformLocation(render_pass.Program.Handle, gui_component.UniformName.c_str());
                    switch (gui_component.UniformType) {
                        case EGUIUniformTypeFloat:
                            glUniform1f(uniform_location, gui_component.Data[0]);
                            break;
                        case EGUIUniformTypeVec2:
                            glUniform2f(uniform_location, gui_component.Data[0], gui_component.Data[1]);
                            break;
                        case EGUIUniformTypeVec3:
                            glUniform3f(uniform_location, gui_component.Data[0], gui_component.Data[1], gui_component.Data[2]);
                            break;
                        case EGUIUniformTypeVec4:
                            glUniform4f(uniform_location, gui_component.Data[0], gui_component.Data[1], gui_component.Data[2], gui_component.Data[3]);
                            break;
                    }
                }

                for (const Texture& texture : render_pass.Textures) {
                    glActiveTexture(GL_TEXTURE0 + texture_unit);
                    glBindTexture(GL_TEXTURE_2D, texture.Id);
                    glUniform1i(glGetUniformLocation(render_pass.Program.Handle, texture.Binding.c_str()), texture_unit);
                    glUniform2f(glGetUniformLocation(render_pass.Program.Handle, (texture.Binding + "_resolution").c_str()), texture.Width, texture.Height);
                    ++texture_unit;
                }

                glBindVertexArray(live_glsl->VaoId);

                for (auto& render_pass : live_glsl->RenderPasses) {
                    if (render_pass.IsMain) {
                        GLint position_attrib = glGetAttribLocation(render_pass.Program.Handle, "position");
                        glVertexAttribPointer(position_attrib, 2, GL_FLOAT, GL_FALSE, 2 * sizeof(float), 0);
                        glEnableVertexAttribArray(position_attrib);
                    }
                }

                glDrawArrays(GL_TRIANGLES, 0, 6);
            }

            live_glsl->IsContinuousRendering = false;
            for (const auto& render_pass : live_glsl->RenderPasses) {
                live_glsl->IsContinuousRendering |= glGetUniformLocation(render_pass.Program.Handle, "time") != -1;
            }

            if (!live_glsl->Args.Output.empty()) {
                uint32_t width = live_glsl->WindowWidth * live_glsl->PixelDensity;
                uint32_t height = live_glsl->WindowHeight * live_glsl->PixelDensity;
                unsigned char* pixels = new unsigned char[3 * width * height];
                glReadPixels(0, 0, width, height, GL_RGB, GL_UNSIGNED_BYTE, pixels);

                int res = stbi_write_png(live_glsl->Args.Output.c_str(), width, height, 3, pixels, 3 * width);
                delete[] pixels;
                if (res == 0) {
                    fprintf(stderr, "Failed to write image to file: %s\n", live_glsl->Args.Output.c_str());
                    return EXIT_FAILURE;
                }
                return EXIT_SUCCESS;
            }
        } else {
            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glClear(GL_COLOR_BUFFER_BIT);
        }
        
        GUIRender(live_glsl->GUI);

        glfwSwapBuffers(live_glsl->GLFWWindowHandle);

        if (live_glsl->IsContinuousRendering) {
            glfwPollEvents();
        } else {
            glfwWaitEvents();
        }
    }

    return EXIT_SUCCESS;
}